

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.cpp
# Opt level: O2

void axl::cry::registerCryptoErrorProviders(void)

{
  ErrorMgr *pEVar1;
  ErrorProvider *pEVar2;
  
  pEVar1 = err::getErrorMgr();
  pEVar2 = &sl::getSimpleSingleton<axl::cry::CryptoErrorProvider>((int32_t *)0x0)->
            super_ErrorProvider;
  err::ErrorMgr::registerProvider(pEVar1,(Guid *)g_cryptoErrorGuid,pEVar2);
  pEVar1 = err::getErrorMgr();
  pEVar2 = &sl::getSimpleSingleton<axl::cry::X509ErrorProvider>((int32_t *)0x0)->super_ErrorProvider
  ;
  err::ErrorMgr::registerProvider(pEVar1,(Guid *)g_x509ErrorGuid,pEVar2);
  OPENSSL_init_crypto(2,0);
  return;
}

Assistant:

void
registerCryptoErrorProviders() {
	err::getErrorMgr()->registerProvider(
		g_cryptoErrorGuid,
		sl::getSimpleSingleton<CryptoErrorProvider> ()
	);

	err::getErrorMgr()->registerProvider(
		g_x509ErrorGuid,
		sl::getSimpleSingleton<X509ErrorProvider> ()
	);

	ERR_load_crypto_strings();
}